

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void mips_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  CPUMIPSState_conflict8 *env_00;
  ulong uVar1;
  undefined4 uVar2;
  int iVar3;
  bool local_39;
  CPUMIPSState_conflict8 *env;
  DisasContextBase *__mptr;
  DisasContext_conflict6 *ctx;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  env_00 = (CPUMIPSState_conflict8 *)cs->env_ptr;
  dcbase[4].pc_first = (target_ulong)cs->uc;
  dcbase[1].pc_first = dcbase->pc_first & 0xfffffffffffff000;
  dcbase[1].tb = (TranslationBlock *)0xffffffffffffffff;
  uVar2 = *(undefined4 *)((long)&env_00->insn_flags + 4);
  dcbase[1].is_jmp = *(undefined4 *)&env_00->insn_flags;
  dcbase[1].num_insns = uVar2;
  dcbase[1].max_insns = env_00->CP0_Config1;
  *(int32_t *)&dcbase[1].singlestep_enabled = env_00->CP0_Config2;
  *(int32_t *)&dcbase[2].tb = env_00->CP0_Config3;
  *(int32_t *)((long)&dcbase[2].tb + 4) = env_00->CP0_Config5;
  dcbase[2].is_jmp = DISAS_NEXT;
  dcbase[2].num_insns = 0;
  *(uint *)&dcbase[2].singlestep_enabled = env_00->CP0_Config4 >> 0x10 & 0xff;
  *(bool *)&dcbase[3].tb = (env_00->CP0_Config3 >> 0xc & 1U) != 0;
  *(uint *)((long)&dcbase[3].tb + 4) = env_00->CP0_Config4 >> 0x1d & 3;
  *(bool *)&dcbase[3].pc_first = (env_00->CP0_Config3 >> 0x1a & 1U) != 0;
  *(bool *)((long)&dcbase[3].pc_first + 1) = (env_00->CP0_Config3 >> 0x1b & 1U) != 0;
  dcbase[3].pc_next = env_00->PAMask;
  *(bool *)&dcbase[3].is_jmp = (env_00->CP0_Config5 >> 5 & 1U) != 0;
  *(bool *)((long)&dcbase[3].is_jmp + 1) = (env_00->CP0_Config5 >> 0x1c & 1U) != 0;
  *(bool *)((long)&dcbase[3].is_jmp + 2) = (env_00->CP0_Config3 >> 0x19 & 1U) != 0;
  dcbase[3].num_insns = env_00->CP0_LLAddr_shift;
  *(bool *)((long)&dcbase[3].max_insns + 2) = (env_00->CP0_Config3 >> 0x1d & 1U) != 0;
  *(uint32_t *)&dcbase[2].pc_next = dcbase->tb->flags;
  *(bool *)&dcbase[2].max_insns = (env_00->CP0_Config3 >> 0xd & 1U) != 0;
  local_39 = true;
  if (((env_00->active_fpu).fcr0 >> 0x12 & 1) == 0) {
    local_39 = (env_00->insn_flags & 0x3000000000000) != 0;
  }
  *(bool *)&dcbase[3].max_insns = local_39;
  *(bool *)((long)&dcbase[3].max_insns + 1) = (env_00->CP0_Config5 >> 7 & 1U) != 0;
  *(bool *)((long)&dcbase[3].max_insns + 3) = (env_00->CP0_Config5 >> 3 & 1U) != 0;
  dcbase[3].singlestep_enabled = ((env_00->active_fpu).fcr31 >> 0x12 & 1) != 0;
  dcbase[3].field_0x25 = ((env_00->active_fpu).fcr31 >> 0x13 & 1) != 0;
  dcbase[3].field_0x27 = (env_00->CP0_Config5 >> 0x11 & 1U) != 0;
  *(uint *)&dcbase[4].tb = env_00->CP0_Config5 >> 0xf & 3;
  restore_cpu_state(env_00,(DisasContext_conflict6 *)dcbase);
  iVar3 = hflags_mmu_index((uint32_t)dcbase[2].pc_next);
  *(int *)&dcbase[2].pc_first = iVar3;
  uVar1._0_4_ = dcbase[1].is_jmp;
  uVar1._4_4_ = dcbase[1].num_insns;
  uVar2 = 0;
  if ((uVar1 & 0x2000) != 0) {
    uVar2 = 0x70;
  }
  *(undefined4 *)((long)&dcbase[2].pc_first + 4) = uVar2;
  return;
}

Assistant:

static void mips_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    CPUMIPSState *env = cs->env_ptr;

    // unicorn setup
    ctx->uc = cs->uc;

    ctx->page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
    ctx->saved_pc = -1;
    ctx->insn_flags = env->insn_flags;
    ctx->CP0_Config1 = env->CP0_Config1;
    ctx->CP0_Config2 = env->CP0_Config2;
    ctx->CP0_Config3 = env->CP0_Config3;
    ctx->CP0_Config5 = env->CP0_Config5;
    ctx->btarget = 0;
    ctx->kscrexist = (env->CP0_Config4 >> CP0C4_KScrExist) & 0xff;
    ctx->rxi = (env->CP0_Config3 >> CP0C3_RXI) & 1;
    ctx->ie = (env->CP0_Config4 >> CP0C4_IE) & 3;
    ctx->bi = (env->CP0_Config3 >> CP0C3_BI) & 1;
    ctx->bp = (env->CP0_Config3 >> CP0C3_BP) & 1;
    ctx->PAMask = env->PAMask;
    ctx->mvh = (env->CP0_Config5 >> CP0C5_MVH) & 1;
    ctx->eva = (env->CP0_Config5 >> CP0C5_EVA) & 1;
    ctx->sc = (env->CP0_Config3 >> CP0C3_SC) & 1;
    ctx->CP0_LLAddr_shift = env->CP0_LLAddr_shift;
    ctx->cmgcr = (env->CP0_Config3 >> CP0C3_CMGCR) & 1;
    /* Restore delay slot state from the tb context.  */
    ctx->hflags = (uint32_t)ctx->base.tb->flags; /* FIXME: maybe use 64 bits? */
    ctx->ulri = (env->CP0_Config3 >> CP0C3_ULRI) & 1;
    ctx->ps = ((env->active_fpu.fcr0 >> FCR0_PS) & 1) ||
             (env->insn_flags & (INSN_LOONGSON2E | INSN_LOONGSON2F));
    ctx->vp = (env->CP0_Config5 >> CP0C5_VP) & 1;
    ctx->mrp = (env->CP0_Config5 >> CP0C5_MRP) & 1;
    ctx->nan2008 = (env->active_fpu.fcr31 >> FCR31_NAN2008) & 1;
    ctx->abs2008 = (env->active_fpu.fcr31 >> FCR31_ABS2008) & 1;
    ctx->mi = (env->CP0_Config5 >> CP0C5_MI) & 1;
    ctx->gi = (env->CP0_Config5 >> CP0C5_GI) & 3;
    restore_cpu_state(env, ctx);
    ctx->mem_idx = hflags_mmu_index(ctx->hflags);
    ctx->default_tcg_memop_mask = (ctx->insn_flags & ISA_MIPS32R6) ?
                                  MO_UNALN : MO_ALIGN;

    LOG_DISAS("\ntb %p idx %d hflags %04x\n", ctx->base.tb, ctx->mem_idx,
              ctx->hflags);
}